

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O2

Literal * Kernel::FracLess<Kernel::RealConstantType>::normalizedLit
                    (bool polarity,TermList lhs,TermList rhs)

{
  TermList a1;
  int iVar1;
  TermList TVar2;
  Literal *pLVar3;
  
  if (normalizedLit(bool,Kernel::TermList,Kernel::TermList)::zero == '\0') {
    iVar1 = __cxa_guard_acquire(&normalizedLit(bool,Kernel::TermList,Kernel::TermList)::zero);
    if (iVar1 != 0) {
      normalizedLit::zero._content = (uint64_t)NumTraits<Kernel::RealConstantType>::zeroT();
      __cxa_guard_release(&normalizedLit(bool,Kernel::TermList,Kernel::TermList)::zero);
    }
  }
  a1._content = normalizedLit::zero._content;
  TVar2 = NumTraits<Kernel::RealConstantType>::minus(lhs);
  TVar2 = NumTraits<Kernel::RealConstantType>::add(rhs,TVar2);
  pLVar3 = NumTraits<Kernel::RealConstantType>::less(polarity,a1,TVar2);
  return pLVar3;
}

Assistant:

static Literal* normalizedLit(bool polarity, TermList lhs, TermList rhs) {
    static auto zero = TermList(number::zeroT());
    return number::less(
              polarity,
              zero,
              number::add(rhs, number::minus(lhs)));
  }